

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintExpressionContents::visitThrow(PrintExpressionContents *this,Throw *curr)

{
  string_view str;
  
  str._M_str = "throw ";
  str._M_len = 6;
  printMedium(this->o,str);
  Name::print(&curr->tag,this->o);
  return;
}

Assistant:

void visitThrow(Throw* curr) {
    printMedium(o, "throw ");
    curr->tag.print(o);
  }